

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kparser.cpp
# Opt level: O2

int __thiscall KParser::_statement(KParser *this,int begin,BlockInfo *bi)

{
  int iVar1;
  BlockInfo BStack_268;
  BlockInfo local_228;
  BlockInfo local_1e8;
  BlockInfo local_1a8;
  BlockInfo local_168;
  BlockInfo local_128;
  BlockInfo local_e8;
  BlockInfo local_a8;
  BlockInfo local_68;
  
  BlockInfo::BlockInfo(&local_68,bi);
  iVar1 = _if(this,begin,&local_68);
  BlockInfo::~BlockInfo(&local_68);
  if (iVar1 < 0) {
    BlockInfo::BlockInfo(&local_a8,bi);
    iVar1 = _while(this,begin,&local_a8);
    BlockInfo::~BlockInfo(&local_a8);
    if (iVar1 < 0) {
      BlockInfo::BlockInfo(&local_e8,bi);
      iVar1 = _assign(this,begin,&local_e8);
      BlockInfo::~BlockInfo(&local_e8);
      if (iVar1 < 0) {
        BlockInfo::BlockInfo(&local_128,bi);
        iVar1 = _decassign(this,begin,&local_128);
        BlockInfo::~BlockInfo(&local_128);
        if (iVar1 < 0) {
          BlockInfo::BlockInfo(&local_168,bi);
          iVar1 = _block(this,begin,&local_168);
          BlockInfo::~BlockInfo(&local_168);
          if (iVar1 < 0) {
            BlockInfo::BlockInfo(&local_1a8,bi);
            iVar1 = _break(this,begin,&local_1a8);
            BlockInfo::~BlockInfo(&local_1a8);
            if (iVar1 < 0) {
              BlockInfo::BlockInfo(&local_1e8,bi);
              iVar1 = _continue(this,begin,&local_1e8);
              BlockInfo::~BlockInfo(&local_1e8);
              if (iVar1 < 0) {
                BlockInfo::BlockInfo(&local_228,bi);
                iVar1 = _simple_expr(this,begin,&local_228);
                BlockInfo::~BlockInfo(&local_228);
                if (iVar1 < 0) {
                  BlockInfo::BlockInfo(&BStack_268,bi);
                  iVar1 = _return(this,begin,&BStack_268);
                  BlockInfo::~BlockInfo(&BStack_268);
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int KParser::_statement(int begin,  BlockInfo bi) {
    int i = begin;
    int t = 0;
    if((t = _if(i, bi)) >= 0) {
        i = t;
    } else if((t = _while(i, bi)) >= 0) {
        i = t;
    }else if((t = _assign(i, bi)) >= 0) {
        i = t;
    } else if((t = _decassign(i, bi)) >= 0) {
        i = t;
    } else if((t = _block(i, bi)) >= 0) {
        i = t;
    } else if((t = _break(i, bi)) >= 0) {
        i = t;
    } else if((t = _continue(i, bi)) >= 0) {
        i = t;
    }else if((t = _simple_expr(i, bi)) >= 0) {
        i = t;
    } else if((t = _return(i, bi)) >= 0) {
        i = t;
    } else {
        return -1;
    }
    return i;
}